

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

char_t * pugi::impl::anon_unknown_0::strconv_cdata(char_t *s,char_t endch)

{
  byte bVar1;
  char_t *pcVar2;
  byte *s_00;
  bool bVar3;
  gap g;
  gap local_38;
  
  local_38.end = (char_t *)0x0;
  local_38.size = 0;
  do {
    s_00 = (byte *)s;
    if (((anonymous_namespace)::chartype_table[(byte)*s] & 0x10) == 0) {
      if (((anonymous_namespace)::chartype_table[((byte *)s)[1]] & 0x10) != 0) {
        s_00 = (byte *)s + 1;
        goto LAB_00107d2c;
      }
      if (((anonymous_namespace)::chartype_table[((byte *)s)[2]] & 0x10) != 0) {
        s_00 = (byte *)s + 2;
        goto LAB_00107d2c;
      }
      bVar3 = ((anonymous_namespace)::chartype_table[((byte *)s)[3]] & 0x10) == 0;
      if (bVar3) {
        s_00 = (byte *)s + 4;
      }
      else {
        s_00 = (byte *)s + 3;
      }
    }
    else {
LAB_00107d2c:
      bVar3 = false;
    }
    s = (char_t *)s_00;
    if (!bVar3) {
      bVar1 = *s_00;
      if (bVar1 == 0xd) {
        s = (char_t *)(s_00 + 1);
        *s_00 = 10;
        if (s_00[1] == 10) {
          if ((byte *)local_38.end != (byte *)0x0) {
            if (s < local_38.end) {
              __assert_fail("s >= end",
                            "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                            ,0x974,
                            "void pugi::impl::(anonymous namespace)::gap::push(char_t *&, size_t)");
            }
            memmove(local_38.end + -local_38.size,local_38.end,(long)s - (long)local_38.end);
          }
          s = (char_t *)(s_00 + 2);
          local_38.size = local_38.size + 1;
          local_38.end = s;
        }
      }
      else {
        if (bVar1 == 0x5d) {
          if ((s_00[1] == 0x5d) && ((s_00[2] == 0x3e || (endch == '>' && s_00[2] == 0)))) {
            pcVar2 = gap::flush(&local_38,(char_t *)s_00);
            *pcVar2 = '\0';
            return (char_t *)(s_00 + 1);
          }
        }
        else if (bVar1 == 0) {
          return (char_t *)0x0;
        }
        s = (char_t *)(s_00 + 1);
      }
    }
  } while( true );
}

Assistant:

PUGI__FN char_t* strconv_cdata(char_t* s, char_t endch)
	{
		gap g;

		while (true)
		{
			PUGI__SCANWHILE_UNROLL(!PUGI__IS_CHARTYPE(ss, ct_parse_cdata));

			if (*s == '\r') // Either a single 0x0d or 0x0d 0x0a pair
			{
				*s++ = '\n'; // replace first one with 0x0a

				if (*s == '\n') g.push(s, 1);
			}
			else if (s[0] == ']' && s[1] == ']' && PUGI__ENDSWITH(s[2], '>')) // CDATA ends here
			{
				*g.flush(s) = 0;

				return s + 1;
			}
			else if (*s == 0)
			{
				return 0;
			}
			else ++s;
		}
	}